

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O2

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>(void)

{
  expression_not_differentiable_exception *this;
  allocator<char> local_39;
  string local_38;
  
  this = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"modulus operation not differentiable!",&local_39);
  expression_not_differentiable_exception::expression_not_differentiable_exception(this,&local_38);
  __cxa_throw(this,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * /*e*/, op_fabs<NumericT>, const InterfaceType * /*diff_var*/)
  {
    throw expression_not_differentiable_exception("modulus operation not differentiable!");
    return NULL;  //TODO: Think about returning a piecewise function here?
  }